

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_2::verifyGreenImage(Surface *image,TestLog *log)

{
  RGBA RVar1;
  int iVar2;
  int iVar3;
  MessageBuilder *pMVar4;
  TestLog *pTVar5;
  ConstPixelBufferAccess local_6d0;
  allocator<char> local_6a1;
  string local_6a0;
  allocator<char> local_679;
  string local_678;
  LogImage local_658;
  MessageBuilder local_5c8;
  ConstPixelBufferAccess local_448;
  allocator<char> local_419;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0;
  LogImage local_3d0;
  MessageBuilder local_340;
  undefined4 local_1bc;
  RGBA local_1b8;
  int greenThreshold;
  RGBA color;
  int x;
  int y;
  MessageBuilder local_1a0;
  byte local_19;
  TestLog *pTStack_18;
  bool error;
  TestLog *log_local;
  Surface *image_local;
  
  local_19 = 0;
  pTStack_18 = log;
  log_local = (TestLog *)image;
  tcu::TestLog::operator<<(&local_1a0,log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<
                     (&local_1a0,(char (*) [41])"Verifying result image, expecting green.");
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  color.m_value = 0;
  do {
    RVar1.m_value = color.m_value;
    iVar2 = tcu::Surface::getHeight((Surface *)log_local);
    pTVar5 = pTStack_18;
    if (iVar2 <= (int)RVar1.m_value) {
      if ((local_19 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_678,"ResultImage",&local_679);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6a0,"Result Image",&local_6a1);
        tcu::Surface::getAccess(&local_6d0,(Surface *)log_local);
        tcu::LogImage::LogImage
                  (&local_658,&local_678,&local_6a0,&local_6d0,QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_658);
        tcu::TestLog::operator<<(&local_5c8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar4 = tcu::MessageBuilder::operator<<
                           (&local_5c8,(char (*) [27])"Image verification passed.");
        tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_5c8);
        tcu::LogImage::~LogImage(&local_658);
        std::__cxx11::string::~string((string *)&local_6a0);
        std::allocator<char>::~allocator(&local_6a1);
        std::__cxx11::string::~string((string *)&local_678);
        std::allocator<char>::~allocator(&local_679);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3f0,"ResultImage",&local_3f1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_418,"Result Image",&local_419);
        tcu::Surface::getAccess(&local_448,(Surface *)log_local);
        tcu::LogImage::LogImage
                  (&local_3d0,&local_3f0,&local_418,&local_448,QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_3d0);
        tcu::TestLog::operator<<(&local_340,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar4 = tcu::MessageBuilder::operator<<
                           (&local_340,(char (*) [27])"Image verification failed.");
        tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_340);
        tcu::LogImage::~LogImage(&local_3d0);
        std::__cxx11::string::~string((string *)&local_418);
        std::allocator<char>::~allocator(&local_419);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::allocator<char>::~allocator(&local_3f1);
      }
      return (bool)((local_19 ^ 0xff) & 1);
    }
    greenThreshold = 0;
    while( true ) {
      iVar2 = greenThreshold;
      iVar3 = tcu::Surface::getWidth((Surface *)log_local);
      if (iVar3 <= iVar2) break;
      local_1b8 = tcu::Surface::getPixel((Surface *)log_local,greenThreshold,color.m_value);
      local_1bc = 8;
      iVar2 = tcu::RGBA::getRed(&local_1b8);
      if (iVar2 < 1) {
        iVar2 = tcu::RGBA::getGreen(&local_1b8);
        if (iVar2 < 0xf7) goto LAB_006fa08a;
        iVar2 = tcu::RGBA::getBlue(&local_1b8);
        if (0 < iVar2) goto LAB_006fa08a;
      }
      else {
LAB_006fa08a:
        local_19 = 1;
      }
      greenThreshold = greenThreshold + 1;
    }
    color.m_value = color.m_value + 1;
  } while( true );
}

Assistant:

static bool verifyGreenImage (const tcu::Surface& image, tcu::TestLog& log)
{
	bool error = false;

	log << tcu::TestLog::Message << "Verifying result image, expecting green." << tcu::TestLog::EndMessage;

	// all pixels must be green

	for (int y = 0; y < image.getHeight(); ++y)
	for (int x = 0; x < image.getWidth(); ++x)
	{
		const tcu::RGBA color			= image.getPixel(x, y);
		const int		greenThreshold	= 8;

		if (color.getRed() > 0 || color.getGreen() < 255-greenThreshold || color.getBlue() > 0)
			error = true;
	}

	if (error)
		log	<< tcu::TestLog::Image("ResultImage", "Result Image", image.getAccess())
			<< tcu::TestLog::Message
			<< "Image verification failed."
			<< tcu::TestLog::EndMessage;
	else
		log	<< tcu::TestLog::Image("ResultImage", "Result Image", image.getAccess())
			<< tcu::TestLog::Message
			<< "Image verification passed."
			<< tcu::TestLog::EndMessage;

	return !error;
}